

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

matches * atomvec(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  uint uVar1;
  etype eVar2;
  int iVar3;
  line *plVar4;
  char *__s;
  int iVar5;
  size_t __n;
  ulonglong uVar6;
  expr *peVar7;
  ull uVar8;
  ull uVar9;
  expr *peVar10;
  char *pcVar11;
  expr **ppeVar12;
  matches *pmVar13;
  match *__ptr;
  int iVar14;
  int iVar15;
  long lVar16;
  ulonglong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  ull local_118;
  char *end;
  match res;
  
  if (ctx->reverse == 0) {
    peVar7 = makeex(EXPR_VEC);
    uVar8 = getbf(*(bitfield **)((long)v + 8),a,m,ctx);
    uVar9 = getbf(*(bitfield **)((long)v + 0x10),a,m,ctx);
    if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
      uVar18 = 0xffffffffffffffff;
    }
    else {
      uVar18 = getbf(*(bitfield **)((long)v + 0x18),a,m,ctx);
    }
    iVar5 = 0;
    for (uVar19 = 0; uVar9 != uVar19; uVar19 = uVar19 + 1) {
      if ((uVar18 >> (uVar19 & 0x3f) & 1) == 0) {
        peVar10 = makeex(EXPR_DISCARD);
      }
      else {
        peVar10 = makeex(EXPR_REG);
        peVar10->special = *(int *)((long)v + 0x20);
        lVar16 = (long)iVar5;
        iVar5 = iVar5 + 1;
        pcVar11 = aprint("%s%lld",*v,lVar16 + uVar8);
        peVar10->str = pcVar11;
      }
      iVar3 = peVar7->vexprsnum;
      iVar14 = peVar7->vexprsmax;
      ppeVar12 = peVar7->vexprs;
      if (iVar14 <= iVar3) {
        iVar15 = iVar14 * 2;
        if (iVar14 == 0) {
          iVar15 = 0x10;
        }
        peVar7->vexprsmax = iVar15;
        ppeVar12 = (expr **)realloc(ppeVar12,(long)iVar15 << 3);
        peVar7->vexprs = ppeVar12;
      }
      peVar7->vexprsnum = iVar3 + 1;
      ppeVar12[iVar3] = peVar10;
    }
    iVar5 = ctx->atomsnum;
    iVar3 = ctx->atomsmax;
    if (iVar5 < iVar3) {
      ppeVar12 = ctx->atoms;
    }
    else {
      iVar5 = iVar3 * 2;
      if (iVar3 == 0) {
        iVar5 = 0x10;
      }
      ctx->atomsmax = iVar5;
      ppeVar12 = (expr **)realloc(ctx->atoms,(long)iVar5 << 3);
      ctx->atoms = ppeVar12;
      iVar5 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar5 + 1;
    ppeVar12[iVar5] = peVar7;
  }
  else {
    plVar4 = ctx->line;
    if (plVar4->atomsnum != spos) {
      memset(&res,0,0xb8);
      res.lpos = spos + 1;
      peVar7 = plVar4->atoms[spos];
      if (peVar7->type != EXPR_VEC) {
        return (matches *)0x0;
      }
      uVar1 = peVar7->vexprsnum;
      local_118 = 0;
      uVar18 = 0;
      uVar17 = 0;
      for (uVar19 = 0; uVar1 != uVar19; uVar19 = uVar19 + 1) {
        eVar2 = peVar7->vexprs[uVar19]->type;
        if (eVar2 != EXPR_DISCARD) {
          if (eVar2 != EXPR_REG) {
            return (matches *)0x0;
          }
          pcVar11 = peVar7->vexprs[uVar19]->str;
          __s = *v;
          __n = strlen(__s);
          iVar5 = strncmp(pcVar11,__s,__n);
          if (iVar5 != 0) {
            return (matches *)0x0;
          }
          uVar6 = strtoull(pcVar11 + __n,&end,10);
          if (*end != '\0') {
            return (matches *)0x0;
          }
          uVar8 = uVar6;
          if ((uVar18 != 0) && (bVar20 = uVar6 != uVar17, uVar6 = uVar17, uVar8 = local_118, bVar20)
             ) {
            return (matches *)0x0;
          }
          local_118 = uVar8;
          uVar17 = uVar6 + 1;
          uVar18 = uVar18 | 1L << (uVar19 & 0x3f);
        }
      }
      iVar5 = setbf(&res,*(bitfield **)((long)v + 8),local_118);
      if ((iVar5 != 0) &&
         (iVar5 = setbf(&res,*(bitfield **)((long)v + 0x10),(long)(int)uVar1), iVar5 != 0)) {
        if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
          if ((uVar18 ^ -1L << ((byte)uVar1 & 0x3f)) == 0xffffffffffffffff) goto LAB_0016fd39;
        }
        else {
          iVar5 = setbf(&res,*(bitfield **)((long)v + 0x18),uVar18);
          if (iVar5 != 0) {
LAB_0016fd39:
            pmVar13 = emptymatches();
            iVar5 = pmVar13->mnum;
            iVar3 = pmVar13->mmax;
            __ptr = pmVar13->m;
            if (iVar3 <= iVar5) {
              iVar14 = 0x10;
              if (iVar3 != 0) {
                iVar14 = iVar3 * 2;
              }
              pmVar13->mmax = iVar14;
              __ptr = (match *)realloc(__ptr,(long)iVar14 * 0xb8);
              pmVar13->m = __ptr;
            }
            pmVar13->mnum = iVar5 + 1;
            memcpy(__ptr + iVar5,&res,0xb8);
            return pmVar13;
          }
        }
      }
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomvec APROTO {
	const struct vec *vec = v;
	if (!ctx->reverse) {
		struct expr *expr = makeex(EXPR_VEC);
		ull base = GETBF(vec->bf);
		ull cnt = GETBF(vec->cnt);
		ull mask = -1ull;
		if (vec->mask)
			mask = GETBF(vec->mask);
		int k = 0, i;
		for (i = 0; i < cnt; i++) {
			if (mask & 1ull<<i) {
				struct expr *sexpr = makeex(EXPR_REG);
				sexpr->special = vec->cool;
				sexpr->str = aprint("%s%lld", vec->name,  base + k++);
				ADDARRAY(expr->vexprs, sexpr);
			} else {
				struct expr *sexpr = makeex(EXPR_DISCARD);
				ADDARRAY(expr->vexprs, sexpr);
			}
		}
		ADDARRAY(ctx->atoms, expr);
		return NULL;
	} else {
		if (spos == ctx->line->atomsnum)
			return 0;
		struct match res = { 0, .lpos = spos+1 };
		const struct expr *expr = ctx->line->atoms[spos];
		if (expr->type != EXPR_VEC)
			return 0;
		ull start = 0, cnt = expr->vexprsnum, mask = 0, cur = 0;
		int i;
		for (i = 0; i < cnt; i++) {
			const struct expr *e = expr->vexprs[i];
			if (e->type == EXPR_DISCARD) {
			} else if (e->type == EXPR_REG) {
				if (strncmp(e->str, vec->name, strlen(vec->name)))
					return 0;
				char *end;
				ull num = strtoull(e->str + strlen(vec->name), &end, 10);
				if (*end)
					return 0;
				if (mask) {
					if (num != cur)
						return 0;
					cur++;
				} else {
					start = num;
					cur = num + 1;
				}
				mask |= 1ull << i;
			} else {
				return 0;
			}
		}
		if (!setbf(&res, vec->bf, start))
			return 0;
		if (!setbf(&res, vec->cnt, cnt))
			return 0;
		if (vec->mask) {
			if (!setbf(&res, vec->mask, mask))
				return 0;
		} else {
			if (mask != (1ull << cnt) - 1)
			       return 0;	
		}
		struct matches *rres = emptymatches();
		ADDARRAY(rres->m, res);
		return rres;
	}
}